

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadTorus>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZQuadTorus> *this,TPZGeoMesh *DestMesh,
          TPZGeoElRefPattern<pzgeom::TPZQuadTorus> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  atomic_int *paVar1;
  TPZReference *pTVar2;
  long *plVar3;
  iterator iVar4;
  ostream *poVar5;
  mapped_type_conflict *pmVar6;
  mapped_type_conflict mVar7;
  long lVar8;
  stringstream sout;
  ostream local_1a8 [376];
  
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZQuadTorus>).super_TPZGeoEl =
       &PTR__TPZSavable_016d3720;
  TPZGeoElRefLess<pzgeom::TPZQuadTorus>::TPZGeoElRefLess
            (&this->super_TPZGeoElRefLess<pzgeom::TPZQuadTorus>,&PTR_PTR_016d3010,DestMesh,
             &cp->super_TPZGeoElRefLess<pzgeom::TPZQuadTorus>,gl2lcNdMap,gl2lcElMap);
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZQuadTorus>).super_TPZGeoEl =
       &PTR__TPZGeoElRefPattern_016d2d10;
  (this->fSubEl)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  (this->fSubEl).fNAlloc = 0;
  (this->fSubEl).fStore = (long *)0x0;
  (this->fSubEl).fNElements = 0;
  pTVar2 = (cp->fRefPattern).fRef;
  (this->fRefPattern).fRef = pTVar2;
  LOCK();
  paVar1 = &pTVar2->fCounter;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  _sout = 0;
  TPZVec<long>::Resize(&this->fSubEl,(cp->fSubEl).fNElements,(long *)&sout);
  lVar8 = 0;
  do {
    if ((cp->fSubEl).fNElements <= lVar8) {
      return;
    }
    plVar3 = (cp->fSubEl).fStore;
    mVar7 = -1;
    if (plVar3[lVar8] != -1) {
      iVar4 = std::
              _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
              ::find(&gl2lcElMap->_M_t,plVar3 + lVar8);
      if ((_Rb_tree_header *)iVar4._M_node == &(gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header) {
        std::__cxx11::stringstream::stringstream((stringstream *)&sout);
        poVar5 = std::operator<<(local_1a8,"ERROR in - ");
        poVar5 = std::operator<<(poVar5,
                                 "TPZGeoElRefPattern<pzgeom::TPZQuadTorus>::TPZGeoElRefPattern(TPZGeoMesh &, const TPZGeoElRefPattern<TGeo> &, std::map<int64_t, int64_t> &, std::map<int64_t, int64_t> &) [TGeo = pzgeom::TPZQuadTorus]"
                                );
        poVar5 = std::operator<<(poVar5," subelement ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar8);
        poVar5 = std::operator<<(poVar5," index = ");
        poVar5 = std::ostream::_M_insert<long>((long)poVar5);
        std::operator<<(poVar5," is not in the map.");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/tpzgeoelrefpattern.h.h"
                   ,0x7a);
      }
      pmVar6 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
               ::operator[](gl2lcElMap,(cp->fSubEl).fStore + lVar8);
      mVar7 = *pmVar6;
    }
    (this->fSubEl).fStore[lVar8] = mVar7;
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(TPZGeoMesh &DestMesh,
											 const TPZGeoElRefPattern<TGeo> &cp,
											 std::map<int64_t,int64_t> &gl2lcNdMap,
											 std::map<int64_t,int64_t> &gl2lcElMap):
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(DestMesh,cp,gl2lcNdMap,gl2lcElMap),
fRefPattern ( cp.fRefPattern )
{
	int i;
    this->fSubEl.Resize(cp.fSubEl.size(),0);
	for (i=0;i<cp.fSubEl.NElements();i++)
	{
		if (cp.fSubEl[i] == -1)
		{
			this->fSubEl[i] = -1;
			continue;
		}
		if (gl2lcElMap.find(cp.fSubEl[i]) == gl2lcElMap.end())
		{
			std::stringstream sout;
			sout << "ERROR in - " << __PRETTY_FUNCTION__
			<< " subelement " << i << " index = " << cp.fSubEl[i] << " is not in the map.";
#ifdef PZ_LOG
            TPZLogger loggerrefpattern("pz.mesh.tpzgeoelrefpattern");
			LOGPZ_ERROR (loggerrefpattern,sout.str().c_str());
#endif
			DebugStop();
		}
		this->fSubEl[i] = gl2lcElMap[cp.fSubEl[i]];
	}
}